

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper>
               (DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper *testObject,
               TestDetails *details)

{
  TestDetails *details_00;
  pointer pDVar1;
  TestResults *pTVar2;
  int iVar3;
  TestDetails **ppTVar4;
  DeferredTestResultList *pDVar5;
  TestResults **ppTVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  SignalTranslator sig;
  pointer local_4b8;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar4 = CurrentTest::Details();
  *ppTVar4 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar3 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar3 == 0) {
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,"failure");
    pDVar5 = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pDVar1 = (pDVar5->
             super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pDVar5->
        super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
        )._M_impl.super__Vector_impl_data._M_finish == pDVar1) {
      uVar8 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0);
      __cxa_begin_catch(uVar8);
      ppTVar6 = CurrentTest::Results();
      pTVar2 = *ppTVar6;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar4,0x4f);
      TestResults::OnTestFailure
                (pTVar2,&local_4b0,"Unhandled exception in CHECK(result.failed == true)");
      __cxa_end_catch();
    }
    else if (pDVar1->failed == false) {
      ppTVar6 = CurrentTest::Results();
      pTVar2 = *ppTVar6;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar4,0x4f);
      TestResults::OnTestFailure(pTVar2,&local_4b0,"result.failed == true");
    }
    ppTVar6 = CurrentTest::Results();
    pTVar2 = *ppTVar6;
    local_4b8 = (testObject->super_DeferredTestReporterFixture).fileName._M_dataplus._M_p;
    ppTVar4 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar4,0x50);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar2,&local_4b8,&pDVar1->failureFile,&local_4b0);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Unhandled system exception";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}